

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O3

int enum_dsk_prop(char *dir,char *name,char *ver,FINFO **finfo_buf)

{
  finfo **ppfVar1;
  __mode_t _Var2;
  __uid_t __uid;
  byte bVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  DIR *__dirp;
  dirent *pdVar7;
  char *pcVar8;
  FINFO *__ptr;
  FPROP *pFVar9;
  size_t sVar10;
  passwd *ppVar12;
  finfo *pfVar13;
  byte *pbVar14;
  FINFO *pFVar15;
  char *pcVar16;
  char fver [16];
  char tver [16];
  stat sbuf;
  char pname [255];
  char tname [255];
  char pext [255];
  char text [255];
  char namebuf [4096];
  FINFO *local_1518;
  int local_150c;
  char local_14e8 [16];
  char local_14d8 [16];
  stat local_14c8;
  byte local_1438 [256];
  byte local_1338 [256];
  char local_1238 [256];
  char local_1138 [256];
  byte local_1038 [4104];
  ulong uVar11;
  
  piVar6 = __errno_location();
  *piVar6 = 0;
  alarm(TIMEOUT_TIME);
  do {
    *piVar6 = 0;
    __dirp = opendir(dir);
    if (__dirp != (DIR *)0x0) {
      alarm(0);
      alarm(TIMEOUT_TIME);
      pdVar7 = readdir(__dirp);
      alarm(0);
      local_150c = 0;
      local_1518 = (FINFO *)0x0;
      goto LAB_00116fc0;
    }
  } while (*piVar6 == 4);
  alarm(0);
  goto LAB_00116f52;
LAB_00116fc0:
  if (pdVar7 == (dirent *)0x0) {
    if (*piVar6 != 4) {
      closedir(__dirp);
      if (local_150c < 1) {
        return local_150c;
      }
      *finfo_buf = local_1518;
      return local_150c;
    }
    goto LAB_001173de;
  }
  if (((pdVar7->d_name[0] == '.') &&
      ((pdVar7->d_name[1] == '\0' || ((pdVar7->d_name[1] == '.' && (pdVar7->d_name[2] == '\0'))))))
     || (pdVar7->d_ino == 0)) goto LAB_001173de;
  pcVar16 = pdVar7->d_name;
  strcpy((char *)local_1338,pcVar16);
  if (local_1338[0] != 0) {
    pbVar14 = local_1338;
    bVar3 = local_1338[0];
    do {
      pbVar14 = pbVar14 + 1;
      if ((byte)(bVar3 + 0xbf) < 0x1a) {
        pbVar14[-1] = bVar3 | 0x20;
      }
      bVar3 = *pbVar14;
    } while (bVar3 != 0);
  }
  strcpy((char *)local_1438,name);
  if (local_1438[0] != 0) {
    pbVar14 = local_1438;
    bVar3 = local_1438[0];
    do {
      pbVar14 = pbVar14 + 1;
      if ((byte)(bVar3 + 0xbf) < 0x1a) {
        pbVar14[-1] = bVar3 | 0x20;
      }
      bVar3 = *pbVar14;
    } while (bVar3 != 0);
  }
  separate_version((char *)local_1338,local_14d8,0);
  pcVar8 = strrchr((char *)local_1338,0x2e);
  if (pcVar8 == (char *)0x0) {
    local_1138[0] = '\0';
  }
  else {
    *pcVar8 = '\0';
    strcpy(local_1138,pcVar8 + 1);
  }
  pcVar8 = strrchr((char *)local_1438,0x2e);
  if (pcVar8 == (char *)0x0) {
    local_1238[0] = '\0';
  }
  else {
    *pcVar8 = '\0';
    strcpy(local_1238,pcVar8 + 1);
  }
  iVar4 = match_pattern((char *)local_1338,(char *)local_1438);
  if (((iVar4 == 0) || (iVar4 = match_pattern(local_1138,local_1238), iVar4 == 0)) ||
     (iVar4 = match_pattern(local_14d8,ver), iVar4 == 0)) goto LAB_001173de;
  if (FreeFinfoList == (FINFO *)0x0) {
    __ptr = (FINFO *)calloc(1,0x228);
    pfVar13 = local_1518;
    if (__ptr == (FINFO *)0x0) goto LAB_00117471;
    pFVar9 = (FPROP *)calloc(1,0x118);
    __ptr->prop = pFVar9;
    if (pFVar9 == (FPROP *)0x0) {
      free(__ptr);
LAB_00117471:
      do {
        ppfVar1 = &pfVar13->next;
        pfVar13 = *ppfVar1;
      } while (*ppfVar1 != (finfo *)0x0);
      FreeFinfoList = local_1518;
      goto LAB_00117484;
    }
  }
  else {
    __ptr = FreeFinfoList;
    FreeFinfoList = FreeFinfoList->next;
  }
  __ptr->next = local_1518;
  sprintf((char *)local_1038,"%s/%s",dir,pcVar16);
  alarm(TIMEOUT_TIME);
  do {
    *piVar6 = 0;
    iVar4 = stat((char *)local_1038,&local_14c8);
    if (iVar4 != -1) {
      alarm(0);
      goto LAB_00117209;
    }
  } while (*piVar6 == 4);
  alarm(0);
  pfVar13 = __ptr;
  if (*piVar6 != 2) goto LAB_0011743c;
LAB_00117209:
  strcpy((char *)local_1038,pcVar16);
  _Var2 = local_14c8.st_mode;
  if ((local_14c8.st_mode & 0xf000) == 0x4000) {
    __ptr->dirp = 1;
    quote_dname((char *)local_1038);
    strcpy(__ptr->lname,(char *)local_1038);
    sVar10 = strlen((char *)local_1038);
    (__ptr->lname + sVar10)[0] = '>';
    (__ptr->lname + sVar10)[1] = '\0';
    sVar10 = sVar10 + 1;
  }
  else {
    __ptr->dirp = 0;
    quote_fname((char *)local_1038);
    sVar10 = strlen((char *)local_1038);
    strcpy(__ptr->lname,(char *)local_1038);
    __ptr->lname[sVar10] = '\0';
  }
  __ptr->lname_len = sVar10;
  strcpy((char *)local_1038,pcVar16);
  separate_version((char *)local_1038,local_14e8,1);
  if (local_1038[0] != 0) {
    pbVar14 = local_1038;
    bVar3 = local_1038[0];
    do {
      pbVar14 = pbVar14 + 1;
      if ((byte)(bVar3 + 0xbf) < 0x1a) {
        pbVar14[-1] = bVar3 | 0x20;
      }
      bVar3 = *pbVar14;
    } while (bVar3 != 0);
  }
  strcpy(__ptr->no_ver_name,(char *)local_1038);
  if (local_14e8[0] == '\0') {
    uVar5 = 0;
  }
  else {
    uVar11 = strtoul(local_14e8,(char **)0x0,10);
    uVar5 = (uint)uVar11;
  }
  __ptr->version = uVar5;
  __ptr->ino = local_14c8.st_ino;
  __ptr->prop->length = (uint)local_14c8.st_size;
  __ptr->prop->wdate = (int)local_14c8.st_mtim.tv_sec + 0x1c94b00;
  __ptr->prop->rdate = (int)local_14c8.st_atim.tv_sec + 0x1c94b00;
  __ptr->prop->protect = _Var2;
  alarm(TIMEOUT_TIME);
  __uid = local_14c8.st_uid;
  do {
    *piVar6 = 0;
    ppVar12 = getpwuid(__uid);
    if (ppVar12 != (passwd *)0x0) {
      alarm(0);
      pcVar16 = ppVar12->pw_name;
      sVar10 = strlen(pcVar16);
      strcpy(__ptr->prop->author,pcVar16);
      __ptr->prop->author[sVar10] = '\0';
      goto LAB_001173c2;
    }
  } while (*piVar6 == 4);
  alarm(0);
  sVar10 = 0;
LAB_001173c2:
  __ptr->prop->au_len = sVar10;
  local_150c = local_150c + 1;
  local_1518 = __ptr;
LAB_001173de:
  *piVar6 = 0;
  alarm(TIMEOUT_TIME);
  pdVar7 = readdir(__dirp);
  alarm(0);
  goto LAB_00116fc0;
LAB_0011743c:
  do {
    pFVar15 = pfVar13;
    pfVar13 = pFVar15->next;
  } while (pfVar13 != (finfo *)0x0);
  pFVar15->next = FreeFinfoList;
  FreeFinfoList = __ptr;
LAB_00117484:
  closedir(__dirp);
LAB_00116f52:
  *Lisp_errno = *piVar6;
  return -1;
}

Assistant:

static int enum_dsk_prop(char *dir, char *name, char *ver, FINFO **finfo_buf)
{
  struct dirent *dp;
  FINFO *prevp;
  FINFO *nextp;
  int n, rval;
  size_t len;
  DIR *dirp;
  struct passwd *pwd;
  struct stat sbuf;
  char namebuf[MAXPATHLEN];
  char fver[VERSIONLEN];

  errno = 0;
  TIMEOUT0(dirp = opendir(dir));
  if (dirp == NULL) {
    *Lisp_errno = errno;
    return (-1);
  }

  for (S_TOUT(dp = readdir(dirp)), nextp = prevp = (FINFO *)NULL, n = 0;
       dp != (struct dirent *)NULL || errno == EINTR;
       errno = 0, S_TOUT(dp = readdir(dirp)), prevp = nextp)
    if (dp) {
      if (strcmp(dp->d_name, ".") == 0 || strcmp(dp->d_name, "..") == 0 || dp->d_ino == 0) continue;
      MatchP((char *)dp->d_name, name, ver, match, unmatch);
    unmatch:
      continue;
    match:
      AllocFinfo(nextp);
      if (nextp == (FINFO *)NULL) {
        FreeFinfo(prevp);
        closedir(dirp);
        *Lisp_errno = errno;
        return (-1);
      }
      nextp->next = prevp;
      sprintf(namebuf, "%s/%s", dir, dp->d_name);
      TIMEOUT(rval = stat(namebuf, &sbuf));
      if (rval == -1 && errno != ENOENT) {
        /*
         * ENOENT error might be caused by missing symbolic
         * link. We should ignore such error here.
         */
        FreeFinfo(nextp);
        closedir(dirp);
        *Lisp_errno = errno;
        return (-1);
      }

      strcpy(namebuf, dp->d_name);
      if (S_ISDIR(sbuf.st_mode)) {
        nextp->dirp = 1;
        quote_dname(namebuf);
        strcpy(nextp->lname, namebuf);
        len = strlen(namebuf);
        *(nextp->lname + len) = DIRCHAR;
        *(nextp->lname + len + 1) = '\0';
        nextp->lname_len = len + 1;
      } else {
        /* All other types than directory. */
        nextp->dirp = 0;
        quote_fname(namebuf);
        len = strlen(namebuf);
        strcpy(nextp->lname, namebuf);
        *(nextp->lname + len) = '\0';
        nextp->lname_len = len;
      }

      strcpy(namebuf, dp->d_name);
      len = strlen(namebuf);
      separate_version(namebuf, fver, 1);
      DOWNCASE(namebuf);
      strcpy(nextp->no_ver_name, namebuf);
      if (*fver == '\0')
        nextp->version = 0;
      else
        nextp->version = strtoul(fver, (char **)NULL, 10);
      nextp->ino = sbuf.st_ino;
      nextp->prop->length = (unsigned)sbuf.st_size;
      nextp->prop->wdate = (unsigned)ToLispTime(sbuf.st_mtime);
      nextp->prop->rdate = (unsigned)ToLispTime(sbuf.st_atime);
      nextp->prop->protect = (unsigned)sbuf.st_mode;
      TIMEOUT0(pwd = getpwuid(sbuf.st_uid));
      if (pwd == (struct passwd *)NULL) {
        nextp->prop->au_len = 0;
      } else {
        len = strlen(pwd->pw_name);
        strcpy(nextp->prop->author, pwd->pw_name);
        *(nextp->prop->author + len) = '\0';
        nextp->prop->au_len = len;
      }
      n++;
    }
  closedir(dirp);
  if (n > 0) *finfo_buf = prevp;
  return (n);
}